

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

int32_t __thiscall cfd::core::AbstractTransaction::GetVersion(AbstractTransaction *this)

{
  return *this->wally_tx_pointer_;
}

Assistant:

int32_t AbstractTransaction::GetVersion() const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // Type is matched to bitcoin-core
  // return reinterpret_cast<int32_t>(tx_pointer-> version);
  // VC ++ errors and warnings appear, so change to pointer cast
  int32_t *p_version = reinterpret_cast<int32_t *>(&tx_pointer->version);
  return *p_version;
}